

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_float.cpp
# Opt level: O2

short ximu::FixedFloat::toFixed(float floatValue,Qvals q)

{
  float fVar1;
  float fVar2;
  
  fVar2 = (float)(1 << ((byte)q & 0x1f)) * floatValue;
  fVar1 = -32768.0;
  if (-32768.0 <= fVar2) {
    fVar1 = fVar2;
  }
  fVar2 = 32767.0;
  if (fVar1 <= 32767.0) {
    fVar2 = fVar1;
  }
  return (short)(int)fVar2;
}

Assistant:

short FixedFloat::toFixed(float floatValue, Qvals q) {
  int tmp = static_cast<int>(
      floatValue * static_cast<int>(1 << static_cast<int>(q)));

  if (tmp > 32767)
    tmp = 32767;
  else if (tmp < -32768)
    tmp = -32768;

  return static_cast<short>(tmp);
}